

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::ConvertToolPrivate
          (ConvertToolPrivate *this,ConvertSettings *settings)

{
  streambuf *psVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)0x1216de);
  psVar1 = (streambuf *)std::ios::rdbuf();
  std::ostream::ostream(in_RDI + 4,psVar1);
  return;
}

Assistant:

ConvertToolPrivate(ConvertTool::ConvertSettings* settings)
        : m_settings(settings)
        , m_out(std::cout.rdbuf())
    {}